

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NetAliasSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NetAliasSyntax,slang::syntax::NetAliasSyntax_const&>
          (BumpAllocator *this,NetAliasSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  NetAliasSyntax *pNVar8;
  
  pNVar8 = (NetAliasSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetAliasSyntax *)this->endPtr < pNVar8 + 1) {
    pNVar8 = (NetAliasSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pNVar8 + 1);
  }
  (pNVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pNVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pNVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pNVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pNVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pNVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pNVar8->keyword).kind = (args->keyword).kind;
  (pNVar8->keyword).field_0x2 = uVar5;
  (pNVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pNVar8->keyword).rawLen = uVar7;
  (pNVar8->keyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->nets).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->nets).super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar8->nets).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->nets).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar8->nets).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pNVar8->nets).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar8->nets).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->nets).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pNVar8->nets).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pNVar8->nets).super_SyntaxListBase.childCount = (args->nets).super_SyntaxListBase.childCount;
  (pNVar8->nets).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5a00;
  sVar2 = (args->nets).elements._M_extent._M_extent_value;
  (pNVar8->nets).elements._M_ptr = (args->nets).elements._M_ptr;
  (pNVar8->nets).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pNVar8->semi).kind = (args->semi).kind;
  (pNVar8->semi).field_0x2 = uVar5;
  (pNVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pNVar8->semi).rawLen = uVar7;
  (pNVar8->semi).info = pIVar3;
  return pNVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }